

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool is_binary_string(string *v,string *str)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_90;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string local_70 [4];
  int count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *str_local;
  string *v_local;
  
  local_20 = str;
  str_local = v;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)v);
  bVar1 = std::operator==(&local_40,"b:");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)str_local);
    std::__cxx11::string::operator=((string *)local_20,local_70);
    std::__cxx11::string::~string(local_70);
    __range2._4_4_ = 0;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_90._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff70), bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      bVar1 = qpdf::util::is_hex_digit(*pcVar2);
      if (!bVar1) {
        return false;
      }
      __range2._4_4_ = __range2._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    v_local._7_1_ = __range2._4_4_ % 2 == 0;
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

static bool
is_binary_string(std::string const& v, std::string& str)
{
    if (v.substr(0, 2) == "b:") {
        str = v.substr(2);
        int count = 0;
        for (char c: str) {
            if (!util::is_hex_digit(c)) {
                return false;
            }
            ++count;
        }
        return (count % 2 == 0);
    }
    return false;
}